

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::TJ
          (AbstractContentContext *this,GlyphUnicodeMappingListOrDoubleList *inStringsAndSpacing)

{
  double dVar1;
  bool bVar2;
  EStatusCode EVar3;
  int iVar4;
  PDFUsedFont *this_00;
  Trace *pTVar5;
  undefined4 extraout_var;
  GraphicState *pGVar6;
  pointer pSVar7;
  pointer plVar8;
  reference puVar9;
  string local_230;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  _Self local_1e0;
  _List_node_base *local_1d8;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  _Self local_1a0;
  _List_node_base *local_198;
  string local_190;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Self local_140;
  _List_node_base *local_138;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  _Self local_100;
  _List_node_base *local_f8;
  _List_iterator<unsigned_short> local_f0;
  iterator itEncoded;
  iterator itEncodedList;
  StringOrDoubleList stringOrDoubleList;
  undefined1 local_c0 [3];
  char formattingBuffer [5];
  OutputStringBufferStream stringStream;
  string fontName;
  undefined1 local_80 [7];
  bool writeAsCID;
  UShortListList encodedCharachtersListsList;
  ObjectIDType fontObjectID;
  _Self local_50;
  _Self local_48;
  const_iterator it;
  GlyphUnicodeMappingListList stringsList;
  PDFUsedFont *currentFont;
  GlyphUnicodeMappingListOrDoubleList *inStringsAndSpacing_local;
  AbstractContentContext *this_local;
  
  this_00 = GetCurrentFont(this);
  if (this_00 == (PDFUsedFont *)0x0) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Cannot write text, no current font is defined");
    return eSuccess;
  }
  std::__cxx11::
  list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ::list((list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
          *)&it);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
       ::begin(inStringsAndSpacing);
  while( true ) {
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
         ::end(inStringsAndSpacing);
    bVar2 = std::operator!=(&local_48,&local_50);
    if (!bVar2) break;
    pSVar7 = std::
             _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
             ::operator->(&local_48);
    if ((pSVar7->IsDouble & 1U) == 0) {
      pSVar7 = std::
               _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
               ::operator->(&local_48);
      std::__cxx11::
      list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
      ::push_back((list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                   *)&it,&pSVar7->SomeValue);
    }
    std::
    _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
    ::operator++(&local_48);
  }
  std::__cxx11::
  list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::list((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          *)local_80);
  EVar3 = PDFUsedFont::EncodeStringsForShowing
                    (this_00,(GlyphUnicodeMappingListList *)&it,
                     &encodedCharachtersListsList.
                      super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      ._M_impl._M_node._M_size,
                     (list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                      *)local_80,(bool *)(fontName.field_2._M_local_buf + 0xf));
  if (EVar3 != eSuccess) {
    pTVar5 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar5,
                      "AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation"
                     );
    this_local._4_4_ = eFailure;
    fontName.field_2._8_4_ = 1;
    goto LAB_001c5ea8;
  }
  bVar2 = std::__cxx11::
          list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ::empty((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   *)local_80);
  if ((bVar2) ||
     (encodedCharachtersListsList.
      super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl._M_node._M_size == 0)) {
    this_local._4_4_ = eSuccess;
    fontName.field_2._8_4_ = 1;
    goto LAB_001c5ea8;
  }
  iVar4 = (*this->_vptr_AbstractContentContext[2])();
  ResourcesDictionary::AddFontMapping_abi_cxx11_
            ((string *)&stringStream.mOwnsBuffer,(ResourcesDictionary *)CONCAT44(extraout_var,iVar4)
             ,encodedCharachtersListsList.
              super__List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl._M_node._M_size);
  pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
  bVar2 = std::operator!=(&pGVar6->mPlacedFontName,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stringStream.mOwnsBuffer);
  if (bVar2) {
LAB_001c5942:
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    TfLow(this,(string *)&stringStream.mOwnsBuffer,pGVar6->mFontSize);
  }
  else {
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    dVar1 = pGVar6->mPlacedFontSize;
    pGVar6 = GraphicStateStack::GetCurrentState(&this->mGraphicStack);
    if ((dVar1 != pGVar6->mFontSize) || (NAN(dVar1) || NAN(pGVar6->mFontSize))) goto LAB_001c5942;
  }
  OutputStringBufferStream::OutputStringBufferStream((OutputStringBufferStream *)local_c0);
  std::__cxx11::
  list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::list((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&itEncodedList);
  itEncoded._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
       ::begin((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                *)local_80);
  std::_List_iterator<unsigned_short>::_List_iterator(&local_f0);
  if ((fontName.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_198 = (_List_node_base *)
                std::__cxx11::
                list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
                ::begin(inStringsAndSpacing);
    local_48._M_node = local_198;
    while( true ) {
      local_1a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
           ::end(inStringsAndSpacing);
      bVar2 = std::operator!=(&local_48,&local_1a0);
      if (!bVar2) break;
      pSVar7 = std::
               _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
               ::operator->(&local_48);
      if ((pSVar7->IsDouble & 1U) == 0) {
        plVar8 = std::
                 _List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                 ::operator->((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)&itEncoded);
        local_1d8 = (_List_node_base *)
                    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                              (plVar8);
        local_f0._M_node = local_1d8;
        while( true ) {
          plVar8 = std::
                   _List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator->((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)&itEncoded);
          local_1e0._M_node =
               (_List_node_base *)
               std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end(plVar8);
          bVar2 = std::operator!=(&local_f0,&local_1e0);
          if (!bVar2) break;
          puVar9 = std::_List_iterator<unsigned_short>::operator*(&local_f0);
          stringOrDoubleList.
          super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node._M_size._3_1_ = (undefined1)*puVar9;
          OutputStringBufferStream::Write
                    ((OutputStringBufferStream *)local_c0,
                     (Byte *)((long)&stringOrDoubleList.
                                     super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl._M_node._M_size + 3),1);
          std::_List_iterator<unsigned_short>::operator++(&local_f0);
        }
        OutputStringBufferStream::ToString_abi_cxx11_
                  (&local_230,(OutputStringBufferStream *)local_c0);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_210,&local_230);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&itEncodedList,&local_210);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~SomethingOrDouble(&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        OutputStringBufferStream::Reset((OutputStringBufferStream *)local_c0);
        std::_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>::
        operator++((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                    *)&itEncoded);
      }
      else {
        pSVar7 = std::
                 _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                 ::operator->(&local_48);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_1d0,pSVar7->DoubleValue);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&itEncodedList,&local_1d0);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~SomethingOrDouble(&local_1d0);
      }
      std::
      _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
      ::operator++(&local_48);
    }
    TJLow(this,(StringOrDoubleList *)&itEncodedList);
  }
  else {
    local_f8 = (_List_node_base *)
               std::__cxx11::
               list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
               ::begin(inStringsAndSpacing);
    local_48._M_node = local_f8;
    while( true ) {
      local_100._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>_>
           ::end(inStringsAndSpacing);
      bVar2 = std::operator!=(&local_48,&local_100);
      if (!bVar2) break;
      pSVar7 = std::
               _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
               ::operator->(&local_48);
      if ((pSVar7->IsDouble & 1U) == 0) {
        plVar8 = std::
                 _List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                 ::operator->((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)&itEncoded);
        local_138 = (_List_node_base *)
                    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                              (plVar8);
        local_f0._M_node = local_138;
        while( true ) {
          plVar8 = std::
                   _List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator->((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                                 *)&itEncoded);
          local_140._M_node =
               (_List_node_base *)
               std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end(plVar8);
          bVar2 = std::operator!=(&local_f0,&local_140);
          if (!bVar2) break;
          puVar9 = std::_List_iterator<unsigned_short>::operator*(&local_f0);
          stringOrDoubleList.
          super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node._M_size._3_1_ = *(undefined1 *)((long)puVar9 + 1);
          OutputStringBufferStream::Write
                    ((OutputStringBufferStream *)local_c0,
                     (Byte *)((long)&stringOrDoubleList.
                                     super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl._M_node._M_size + 3),1);
          puVar9 = std::_List_iterator<unsigned_short>::operator*(&local_f0);
          stringOrDoubleList.
          super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node._M_size._3_1_ = (undefined1)*puVar9;
          OutputStringBufferStream::Write
                    ((OutputStringBufferStream *)local_c0,
                     (Byte *)((long)&stringOrDoubleList.
                                     super__List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl._M_node._M_size + 3),1);
          std::_List_iterator<unsigned_short>::operator++(&local_f0);
        }
        OutputStringBufferStream::ToString_abi_cxx11_
                  (&local_190,(OutputStringBufferStream *)local_c0);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_170,&local_190);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&itEncodedList,&local_170);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~SomethingOrDouble(&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        OutputStringBufferStream::Reset((OutputStringBufferStream *)local_c0);
        std::_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>::
        operator++((_List_iterator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>
                    *)&itEncoded);
      }
      else {
        pSVar7 = std::
                 _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                 ::operator->(&local_48);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SomethingOrDouble(&local_130,pSVar7->DoubleValue);
        std::__cxx11::
        list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&itEncodedList,&local_130);
        SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~SomethingOrDouble(&local_130);
      }
      std::
      _List_const_iterator<SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
      ::operator++(&local_48);
    }
    TJHexLow(this,(StringOrDoubleList *)&itEncodedList);
  }
  this_local._4_4_ = eSuccess;
  fontName.field_2._8_4_ = 1;
  std::__cxx11::
  list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~list((list<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&itEncodedList);
  OutputStringBufferStream::~OutputStringBufferStream((OutputStringBufferStream *)local_c0);
  std::__cxx11::string::~string((string *)&stringStream.mOwnsBuffer);
LAB_001c5ea8:
  std::__cxx11::
  list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~list((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
           *)local_80);
  std::__cxx11::
  list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
  ::~list((list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           *)&it);
  return this_local._4_4_;
}

Assistant:

EStatusCode AbstractContentContext::TJ(const GlyphUnicodeMappingListOrDoubleList& inStringsAndSpacing)
{
	PDFUsedFont* currentFont = GetCurrentFont();
	if(!currentFont)
	{
		TRACE_LOG("AbstractContentContext::TJ, Cannot write text, no current font is defined");
		return PDFHummus::eSuccess;
	}

	// TJ is a bit different. i want to encode all strings in the array to the same font, so that at most a single
	// Tf is used...and command may be written as is. for that we need to encode all strings at once...which requires
	// a slightly different algorithm

	// first, list all the strings, so that you can encode them
	GlyphUnicodeMappingListList stringsList;
	GlyphUnicodeMappingListOrDoubleList::const_iterator it = inStringsAndSpacing.begin();
	
	for(; it != inStringsAndSpacing.end(); ++it)
		if(!it->IsDouble)
			stringsList.push_back(it->SomeValue);

	// now, encode all strings at once

	ObjectIDType fontObjectID;
	UShortListList encodedCharachtersListsList;
	bool writeAsCID;	

	if(currentFont->EncodeStringsForShowing(stringsList,fontObjectID,encodedCharachtersListsList,writeAsCID)!= PDFHummus::eSuccess)
	{
		TRACE_LOG("AbstractContentContext::TJ, Unexepcted failure, cannot include characters for writing final representation");
		return PDFHummus::eFailure;
	}
	
	// skip if there's no text going to be written (also means no font ID)
	if(encodedCharachtersListsList.empty() || 0 == fontObjectID)
		return PDFHummus::eSuccess;

	// status only returns if strings can be coded or not. so continue with writing regardless

	// Write the font reference (only if required)
	std::string fontName = GetResourcesDictionary()->AddFontMapping(fontObjectID);

	if(mGraphicStack.GetCurrentState().mPlacedFontName != fontName ||
		mGraphicStack.GetCurrentState().mPlacedFontSize != mGraphicStack.GetCurrentState().mFontSize)
		TfLow(fontName,mGraphicStack.GetCurrentState().mFontSize);
	
	// Now write the string using the text command
	OutputStringBufferStream stringStream;
	char formattingBuffer[5];
	StringOrDoubleList stringOrDoubleList;
	UShortListList::iterator itEncodedList = encodedCharachtersListsList.begin();
	UShortList::iterator itEncoded;

	if(writeAsCID)
	{
		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = ((*itEncoded) >> 8) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer, 1);					
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJHexLow(stringOrDoubleList);
	}
	else
	{

		for(it = inStringsAndSpacing.begin(); it != inStringsAndSpacing.end(); ++it)
		{
			if(it->IsDouble)
			{
				stringOrDoubleList.push_back(StringOrDouble(it->DoubleValue));
			}
			else
			{
				for(itEncoded = itEncodedList->begin();itEncoded!= itEncodedList->end();++itEncoded)
				{
					formattingBuffer[0] = (*itEncoded) & 0x00ff;
					stringStream.Write((const Byte*)formattingBuffer,1);
				}
				stringOrDoubleList.push_back(StringOrDouble(stringStream.ToString()));
				stringStream.Reset();
				++itEncodedList;
			}
		}
		TJLow(stringOrDoubleList);
	}
	return PDFHummus::eSuccess;	
}